

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O2

t_namelist * namelist_append_files(t_namelist *listwas,char *s)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  char temp [1000];
  char local_3f8 [1000];
  
  do {
    pcVar3 = s;
    for (lVar2 = 0; s = pcVar3 + 1, lVar2 != 999; lVar2 = lVar2 + 1) {
      cVar1 = *pcVar3;
      if ((cVar1 == '\0') || (cVar1 == ':')) {
        local_3f8[lVar2] = '\0';
        if (lVar2 != 0) goto LAB_001706ab;
        s = (char *)0x0;
        goto LAB_001706b8;
      }
      local_3f8[lVar2] = cVar1;
      pcVar3 = s;
    }
    local_3f8[999] = 0;
LAB_001706ab:
    if (*pcVar3 == '\0') {
      s = (char *)0x0;
    }
LAB_001706b8:
    if (local_3f8[0] != '\0') {
      listwas = namelist_append(listwas,local_3f8,0);
    }
    if (s == (char *)0x0) {
      return listwas;
    }
  } while( true );
}

Assistant:

t_namelist *namelist_append_files(t_namelist *listwas, const char *s)
{
    const char *npos;
    char temp[MAXPDSTRING];
    t_namelist *nl = listwas;

    npos = s;
    do
    {
        npos = strtokcpy(temp, sizeof(temp), npos, SEPARATOR);
        if (! *temp) continue;
        nl = namelist_append(nl, temp, 0);
    }
        while (npos);
    return (nl);
}